

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::applyFunction
          (Evaluator *this,GCPtr<symbols::Object> *obj,
          vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *args)

{
  Object *pOVar1;
  FunctionObject *t;
  Env *env;
  GCPtr<symbols::FunctionObject> function;
  GCPtr<symbols::Object> evaluated;
  string strValue;
  GCPtr<symbols::FunctionObject> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*obj->addr->_vptr_Object[3])(&local_38);
  pOVar1 = GCPtr<symbols::Object>::unref(obj);
  if (pOVar1 == (Object *)0x0) {
    t = (FunctionObject *)0x0;
  }
  else {
    t = (FunctionObject *)
        __dynamic_cast(pOVar1,&symbols::Object::typeinfo,&symbols::FunctionObject::typeinfo,0);
  }
  GCPtr<symbols::FunctionObject>::GCPtr(&local_a0,t);
  if (local_a0.addr == (FunctionObject *)0x0) {
    std::operator+(&local_78,"\'",&local_38);
    std::operator+(&local_58,&local_78,"\'");
    std::operator+(&local_98,&local_58," object not a callable");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  env = extendFunctionEnv(&local_a0,args);
  evalBlockStatement((Evaluator *)&local_98,(local_a0.addr)->body,env);
  pOVar1 = unWrapReturnvalue((GCPtr<symbols::Object> *)&local_98);
  GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar1);
  GCPtr<symbols::Object>::~GCPtr((GCPtr<symbols::Object> *)&local_98);
  GCPtr<symbols::FunctionObject>::~GCPtr(&local_a0);
  std::__cxx11::string::~string((string *)&local_38);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::applyFunction(GCPtr<Object>& obj, std::vector<GCPtr<Object>>& args){
       auto strValue = obj->toString();
       GCPtr<FunctionObject> function = dynamic_cast<FunctionObject*>(obj.unref());
       if( function == nullptr){
           auto message = "'"+ strValue + "'" + " object not a callable";

       }
       auto env = extendFunctionEnv(function, args);
       auto evaluated = evalBlockStatement(function->body, env);
       return unWrapReturnvalue(evaluated);
}